

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

AbstractStringSerialiserPrivate * __thiscall
AbstractStringSerialiserPrivate::loadImageVariant
          (AbstractStringSerialiserPrivate *this,int type,QString *val)

{
  QBuffer buffer;
  QByteArray byteArray;
  QArrayDataPointer<char> local_40;
  QArrayDataPointer<char> local_28;
  
  QString::toLatin1_helper((QString *)&local_40);
  QByteArray::fromBase64(&local_28,&local_40,0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  QBuffer::QBuffer((QBuffer *)&local_40,(QByteArray *)&local_28,(QObject *)0x0);
  QImage::QImage((QImage *)this);
  QImage::load((QIODevice *)this,(char *)&local_40);
  QBuffer::~QBuffer((QBuffer *)&local_40);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
  return this;
}

Assistant:

QImage AbstractStringSerialiserPrivate::loadImageVariant(int type, const QString &val)
{
    Q_UNUSED(type)
    QByteArray byteArray = QByteArray::fromBase64(val.toLatin1());
    QBuffer buffer(&byteArray);
    QImage imageData;
    imageData.load(&buffer, "PNG");
    return imageData;
}